

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O2

int stbi__start_write_file(stbi__write_context *s,char *filename)

{
  FILE *pFVar1;
  
  pFVar1 = fopen(filename,"wb");
  s->func = stbi__stdio_write;
  s->context = pFVar1;
  return (int)(pFVar1 != (FILE *)0x0);
}

Assistant:

static int stbi__start_write_file(stbi__write_context *s, const char *filename)
{
   FILE *f;
#ifdef STBI_MSC_SECURE_CRT
   if (fopen_s(&f, filename, "wb"))
      f = NULL;
#else
   f = fopen(filename, "wb");
#endif
   stbi__start_write_callbacks(s, stbi__stdio_write, (void *) f);
   return f != NULL;
}